

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  long in_RDI;
  int n_1;
  int n;
  int local_18;
  ImVec2 local_14;
  int local_c;
  
  memset((void *)(in_RDI + 0xb28),0,0x28c);
  for (local_c = 0; local_c < 0x28c; local_c = local_c + 1) {
    *(undefined1 *)(in_RDI + 0xe14 + (long)local_c * 0x10) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 0x10 + 0xe18) = 0xbf800000;
    *(undefined4 *)(in_RDI + (long)local_c * 0x10 + 0xe1c) = 0xbf800000;
  }
  *(undefined1 *)(in_RDI + 0xe0f) = 0;
  *(undefined1 *)(in_RDI + 0xe0e) = 0;
  *(undefined1 *)(in_RDI + 0xe0d) = 0;
  *(undefined1 *)(in_RDI + 0xe0c) = 0;
  *(undefined4 *)(in_RDI + 0xe10) = 0;
  ImVec2::ImVec2(&local_14,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0xdf4) = local_14;
  for (local_18 = 0; local_18 < 5; local_18 = local_18 + 1) {
    *(undefined1 *)(in_RDI + 0xdfc + (long)local_18) = 0;
    *(undefined4 *)(in_RDI + 0x3774 + (long)local_18 * 4) = 0xbf800000;
    *(undefined4 *)(in_RDI + 0x3760 + (long)local_18 * 4) = 0xbf800000;
  }
  *(undefined4 *)(in_RDI + 0xe08) = 0;
  *(undefined4 *)(in_RDI + 0xe04) = 0;
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    memset(KeysDown, 0, sizeof(KeysDown));
#endif
    for (int n = 0; n < IM_ARRAYSIZE(KeysData); n++)
    {
        KeysData[n].Down             = false;
        KeysData[n].DownDuration     = -1.0f;
        KeysData[n].DownDurationPrev = -1.0f;
    }
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = ImGuiMod_None;
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    for (int n = 0; n < IM_ARRAYSIZE(MouseDown); n++)
    {
        MouseDown[n] = false;
        MouseDownDuration[n] = MouseDownDurationPrev[n] = -1.0f;
    }
    MouseWheel = MouseWheelH = 0.0f;
}